

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_13d2bf8::HandleTargetMode
               (cmExecutionStatus *status,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,string *propertyName,string *propertyValue,bool appendAsString,bool appendMode
               ,bool remove)

{
  cmMakefile *this;
  bool bVar1;
  cmTarget *this_00;
  _Base_ptr p_Var2;
  cmValue value;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_98;
  undefined1 local_78 [16];
  undefined1 local_68;
  undefined7 uStack_67;
  _Base_ptr local_60;
  undefined8 local_58;
  undefined8 local_50;
  _Alloc_hider local_48;
  char *local_40;
  undefined8 local_38;
  
  p_Var2 = (names->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(names->_M_t)._M_impl.super__Rb_tree_header;
  bVar4 = (_Rb_tree_header *)p_Var2 == p_Var3;
  if (!bVar4) {
    do {
      bVar1 = cmMakefile::IsAlias(status->Makefile,(string *)(p_Var2 + 1));
      if (bVar1) {
        local_78._0_8_ = (element_type *)&stack0xffffffffffffff98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,"can not be used on an ALIAS target.","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((element_type *)local_78._0_8_ == (element_type *)&stack0xffffffffffffff98) {
          return bVar4;
        }
        operator_delete((void *)local_78._0_8_,(ulong)(_local_68 + 1));
        return bVar4;
      }
      this_00 = cmMakefile::FindTargetToUse(status->Makefile,(string *)(p_Var2 + 1),false);
      if (this_00 == (cmTarget *)0x0) {
        local_78._0_8_ = (element_type *)0x16;
        local_78._8_8_ = "could not find TARGET ";
        _local_68 = (pointer)0x0;
        local_58 = *(undefined8 *)(p_Var2 + 1);
        local_60 = p_Var2[1]._M_parent;
        local_50 = 0;
        local_48._M_p = (pointer)0x27;
        local_40 = ".  Perhaps it has not yet been created.";
        local_38 = 0;
        views._M_len = 3;
        views._M_array = (iterator)local_78;
        cmCatViews(&local_98,views);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        this = status->Makefile;
        if (appendMode) {
          cmMakefile::GetBacktrace(this);
          local_78._0_8_ = local_98._M_dataplus._M_p;
          local_78._8_8_ = local_98._M_string_length;
          local_98._M_dataplus._M_p = (pointer)0x0;
          local_98._M_string_length = 0;
          local_68 = 1;
          cmTarget::AppendProperty
                    (this_00,propertyName,propertyValue,(optional<cmListFileBacktrace> *)local_78,
                     appendAsString);
          if (((bool)local_68 == true) &&
             (_local_68 = _local_68 & 0xffffffffffffff00,
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
          }
        }
        else {
          value.Value = propertyValue;
          if (remove) {
            value.Value = (string *)0x0;
          }
          cmTarget::SetProperty(this_00,propertyName,value);
        }
        cmTarget::CheckProperty(this_00,propertyName,this);
      }
      if (this_00 == (cmTarget *)0x0) {
        return bVar4;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      bVar4 = (_Rb_tree_header *)p_Var2 == p_Var3;
    } while (!bVar4);
  }
  return bVar4;
}

Assistant:

bool HandleTargetMode(cmExecutionStatus& status,
                      const std::set<std::string>& names,
                      const std::string& propertyName,
                      const std::string& propertyValue, bool appendAsString,
                      bool appendMode, bool remove)
{
  for (std::string const& name : names) {
    if (status.GetMakefile().IsAlias(name)) {
      status.SetError("can not be used on an ALIAS target.");
      return false;
    }
    if (cmTarget* target = status.GetMakefile().FindTargetToUse(name)) {
      // Handle the current target.
      if (!HandleTarget(target, status.GetMakefile(), propertyName,
                        propertyValue, appendAsString, appendMode, remove)) {
        return false;
      }
    } else {
      status.SetError(cmStrCat("could not find TARGET ", name,
                               ".  Perhaps it has not yet been created."));
      return false;
    }
  }
  return true;
}